

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O2

bool __thiscall kws::Generator::CreateHeader(Generator *this,ostream *file,char *title)

{
  ostream *poVar1;
  long lVar2;
  allocator local_61;
  string tit;
  string local_40;
  
  poVar1 = std::operator<<(file,"<html>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"<head>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file," <meta name=\"description\" content=\"kitware.com\" />");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,
                           " <meta name=\"keywords\" content=\"kwstyle,Kitware,Style,Checker,Dart\" />"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file," <meta name=\"author\" content=\"Kitware\" />");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file," <meta name=\"revisit-after\" content=\"2 days\" />");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file," <meta name=\"robots\" content=\"all\" />");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file," <title>KWStyle - ");
  poVar1 = std::operator<<(poVar1,title);
  poVar1 = std::operator<<(poVar1,"</title>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"</head>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"<table width=\"100%\" border=\"0\">");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file," <tr>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"   <td width=\"15%\" height=\"2\"><img src=\"images/");
  std::__cxx11::string::string((string *)&local_40,(this->m_ProjectLogo)._M_dataplus._M_p,&local_61)
  ;
  kwssys::SystemTools::GetFilenameName(&tit,&local_40);
  poVar1 = std::operator<<(poVar1,(string *)&tit);
  poVar1 = std::operator<<(poVar1,"\"></td>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&tit);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(file,"   <td width=\"85%\" height=\"2\" bgcolor=\"#0099CC\"> ");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&tit,title,(allocator *)&local_40);
  lVar2 = std::__cxx11::string::find_last_of((char *)&tit,0x163441);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)&tit);
    std::__cxx11::string::operator=((string *)&tit,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  lVar2 = std::__cxx11::string::find_last_of((char *)&tit,0x155501);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_40,(ulong)&tit);
    std::__cxx11::string::operator=((string *)&tit,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  poVar1 = std::operator<<(file,
                           "     <div align=\"left\"><b><font color=\"#FFFFFF\" size=\"5\">KWStyle - "
                          );
  poVar1 = std::operator<<(poVar1,tit._M_dataplus._M_p);
  poVar1 = std::operator<<(poVar1,"</font></b></div>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"   </td>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file," </tr>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"</table>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"<table width=\"100%\" border=\"0\">");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file," <tr> ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"   <td width=\"15%\" height=\"30\" >&nbsp;</td>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"   <td height=\"30\" width=\"12%\" bgcolor=\"#0099CC\"> ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,
                           "     <div align=\"center\"><a href=\"KWSMatrix.html\">Matrix View</a></div>"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"   </td>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"   <td width=\"10%\" height=\"30\" bgcolor=\"#0099CC\" >");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,
                           " <div align=\"center\"><a href=\"KWSDescription.html\">Description</a></div>"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"  </td>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"   <td width=\"63%\" height=\"30\"> ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"     <div align=\"left\"><b></b></div>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"     <div align=\"right\"></div>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"   </td>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file," </tr>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(file,"</table>");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(file,"<hr size=\"1\">");
  std::__cxx11::string::~string((string *)&tit);
  return true;
}

Assistant:

bool Generator::CreateHeader(std::ostream * file,const char* title)
{
  *file << "<html>" << std::endl;
  *file << "<head>" << std::endl;
  *file << R"( <meta name="description" content="kitware.com" />)" << std::endl;
  *file
      << R"( <meta name="keywords" content="kwstyle,Kitware,Style,Checker,Dart" />)"
      << std::endl;
  *file << R"( <meta name="author" content="Kitware" />)" << std::endl;
  *file << R"( <meta name="revisit-after" content="2 days" />)" << std::endl;
  *file << R"( <meta name="robots" content="all" />)" << std::endl;
  *file << " <title>KWStyle - " << title << "</title>" << std::endl;
  *file << "</head>" << std::endl;

  // Now create the top frame
  *file << R"(<table width="100%" border="0">)" << std::endl;
  *file << " <tr>" << std::endl;
  *file << R"(   <td width="15%" height="2"><img src="images/)"
        << kwssys::SystemTools::GetFilenameName(m_ProjectLogo.c_str())
        << "\"></td>" << std::endl;
  *file << R"(   <td width="85%" height="2" bgcolor="#0099CC"> )" << std::endl;

  // remove the last extension
  std::string tit = title;
  auto pos = static_cast<long int>(tit.find_last_of("."));
  if (pos != -1) {
    tit = tit.substr(0, pos);
   }
 pos = static_cast<long int>(tit.find_last_of("/"));
 if(pos!=-1)
   {
   tit = tit.substr(pos+1,tit.size()-pos-1);
   }

   *file
       << R"(     <div align="left"><b><font color="#FFFFFF" size="5">KWStyle - )"
       << tit.c_str() << "</font></b></div>" << std::endl;
   *file << "   </td>" << std::endl;
   *file << " </tr>" << std::endl;
   *file << "</table>" << std::endl;
   *file << R"(<table width="100%" border="0">)" << std::endl;
   *file << " <tr> " << std::endl;
   *file << R"(   <td width="15%" height="30" >&nbsp;</td>)" << std::endl;
   *file << R"(   <td height="30" width="12%" bgcolor="#0099CC"> )"
         << std::endl;
   *file
       << R"(     <div align="center"><a href="KWSMatrix.html">Matrix View</a></div>)"
       << std::endl;
   *file << "   </td>" << std::endl;
   *file << R"(   <td width="10%" height="30" bgcolor="#0099CC" >)"
         << std::endl;
   *file
       << R"( <div align="center"><a href="KWSDescription.html">Description</a></div>)"
       << std::endl;
   *file << "  </td>" << std::endl;
   *file << R"(   <td width="63%" height="30"> )" << std::endl;
   *file << "     <div align=\"left\"><b></b></div>" << std::endl;
   *file << "     <div align=\"right\"></div>" << std::endl;
   *file << "   </td>" << std::endl;
   *file << " </tr>" << std::endl;
   *file << "</table>" << std::endl;
   *file << "<hr size=\"1\">";
   return true;
}